

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O1

int secp256k1_musig_pubkey_agg
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *agg_pk,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_pubkey **pubkeys,size_t n_pubkeys
              )

{
  byte bVar1;
  secp256k1_context *ctx_00;
  secp256k1_pubkey **ppsVar2;
  uchar *p1;
  size_t sVar3;
  secp256k1_fe *rzr;
  int iVar4;
  uint64_t *puVar5;
  undefined8 *puVar6;
  long lVar7;
  secp256k1_keyagg_cache_internal *psVar8;
  undefined8 *puVar9;
  byte bVar10;
  uchar ser [33];
  secp256k1_ge point;
  secp256k1_musig_pubkey_agg_ecmult_data ecmult_data;
  secp256k1_gej pkj;
  secp256k1_ge pk;
  secp256k1_scalar scalar;
  undefined1 local_328 [104];
  undefined1 local_2c0 [16];
  int local_2b0;
  secp256k1_ge local_2a8;
  secp256k1_context *local_250;
  uchar local_248 [8];
  uchar auStack_240 [8];
  uchar local_238 [8];
  uchar auStack_230 [8];
  secp256k1_pubkey **local_228;
  undefined1 local_220 [32];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  int local_1d0;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  uint64_t local_158;
  int local_150;
  undefined1 local_148 [24];
  undefined8 uStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  uint64_t local_d8;
  int local_d0;
  uchar local_98 [8];
  uchar auStack_90 [8];
  uchar local_88 [8];
  uchar auStack_80 [8];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined8 local_58;
  secp256k1_scalar local_50;
  
  bVar10 = 0;
  if (agg_pk != (secp256k1_xonly_pubkey *)0x0) {
    agg_pk->data[0x30] = '\0';
    agg_pk->data[0x31] = '\0';
    agg_pk->data[0x32] = '\0';
    agg_pk->data[0x33] = '\0';
    agg_pk->data[0x34] = '\0';
    agg_pk->data[0x35] = '\0';
    agg_pk->data[0x36] = '\0';
    agg_pk->data[0x37] = '\0';
    agg_pk->data[0x38] = '\0';
    agg_pk->data[0x39] = '\0';
    agg_pk->data[0x3a] = '\0';
    agg_pk->data[0x3b] = '\0';
    agg_pk->data[0x3c] = '\0';
    agg_pk->data[0x3d] = '\0';
    agg_pk->data[0x3e] = '\0';
    agg_pk->data[0x3f] = '\0';
    agg_pk->data[0x20] = '\0';
    agg_pk->data[0x21] = '\0';
    agg_pk->data[0x22] = '\0';
    agg_pk->data[0x23] = '\0';
    agg_pk->data[0x24] = '\0';
    agg_pk->data[0x25] = '\0';
    agg_pk->data[0x26] = '\0';
    agg_pk->data[0x27] = '\0';
    agg_pk->data[0x28] = '\0';
    agg_pk->data[0x29] = '\0';
    agg_pk->data[0x2a] = '\0';
    agg_pk->data[0x2b] = '\0';
    agg_pk->data[0x2c] = '\0';
    agg_pk->data[0x2d] = '\0';
    agg_pk->data[0x2e] = '\0';
    agg_pk->data[0x2f] = '\0';
    agg_pk->data[0x10] = '\0';
    agg_pk->data[0x11] = '\0';
    agg_pk->data[0x12] = '\0';
    agg_pk->data[0x13] = '\0';
    agg_pk->data[0x14] = '\0';
    agg_pk->data[0x15] = '\0';
    agg_pk->data[0x16] = '\0';
    agg_pk->data[0x17] = '\0';
    agg_pk->data[0x18] = '\0';
    agg_pk->data[0x19] = '\0';
    agg_pk->data[0x1a] = '\0';
    agg_pk->data[0x1b] = '\0';
    agg_pk->data[0x1c] = '\0';
    agg_pk->data[0x1d] = '\0';
    agg_pk->data[0x1e] = '\0';
    agg_pk->data[0x1f] = '\0';
    agg_pk->data[0] = '\0';
    agg_pk->data[1] = '\0';
    agg_pk->data[2] = '\0';
    agg_pk->data[3] = '\0';
    agg_pk->data[4] = '\0';
    agg_pk->data[5] = '\0';
    agg_pk->data[6] = '\0';
    agg_pk->data[7] = '\0';
    agg_pk->data[8] = '\0';
    agg_pk->data[9] = '\0';
    agg_pk->data[10] = '\0';
    agg_pk->data[0xb] = '\0';
    agg_pk->data[0xc] = '\0';
    agg_pk->data[0xd] = '\0';
    agg_pk->data[0xe] = '\0';
    agg_pk->data[0xf] = '\0';
  }
  if (pubkeys == (secp256k1_pubkey **)0x0) {
    secp256k1_musig_pubkey_agg_cold_2();
  }
  else if (n_pubkeys == 0) {
    secp256k1_musig_pubkey_agg_cold_1();
  }
  else {
    local_1d0 = 1;
    local_220._0_16_ = (undefined1  [16])0x0;
    local_220._16_16_ = (undefined1  [16])0x0;
    local_200 = (undefined1  [16])0x0;
    local_1f0 = (undefined1  [16])0x0;
    local_1e0 = (undefined1  [16])0x0;
    local_250 = ctx;
    local_228 = pubkeys;
    if (n_pubkeys != 1) {
      sVar3 = 1;
LAB_00110553:
      lVar7 = 0;
      do {
        bVar1 = pubkeys[sVar3]->data[lVar7];
        iVar4 = (uint)(*pubkeys)->data[lVar7] - (uint)bVar1;
        if ((*pubkeys)->data[lVar7] != bVar1) goto LAB_00110580;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      iVar4 = 0;
LAB_00110580:
      if (iVar4 == 0) goto code_r0x00110584;
      iVar4 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)local_148,pubkeys[sVar3]);
      if (iVar4 == 0) {
        return 0;
      }
      puVar6 = (undefined8 *)local_148;
      puVar9 = (undefined8 *)local_220;
      for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar9 = *puVar6;
        puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
      }
    }
LAB_001105bb:
    local_148._8_8_ = 0x7c5b7f16badac71;
    local_148._0_8_ = 0xc8fff302b399d5e0;
    uStack_130 = 0xab148a38201a4c7b;
    local_148._16_8_ = 0x2a72ecf89701e2ef;
    local_e8._0_8_ = 0x40;
    sVar3 = 0;
    do {
      local_1c8._0_8_ = 0x21;
      iVar4 = secp256k1_ec_pubkey_serialize(ctx,local_328,(size_t *)local_1c8,pubkeys[sVar3],0x102);
      if (iVar4 == 0) goto LAB_00110669;
      secp256k1_sha256_write((secp256k1_sha256 *)local_148,local_328,0x21);
      sVar3 = sVar3 + 1;
    } while (n_pubkeys != sVar3);
    secp256k1_sha256_finalize((secp256k1_sha256 *)local_148,local_248);
LAB_00110669:
    if (iVar4 != 0) {
      local_150 = 1;
      local_1c8._0_16_ = (undefined1  [16])0x0;
      local_1c8._16_16_ = (undefined1  [16])0x0;
      local_1a8 = (undefined1  [16])0x0;
      local_198 = (undefined1  [16])0x0;
      local_188 = (undefined1  [16])0x0;
      local_178 = (undefined1  [16])0x0;
      local_168 = (undefined1  [16])0x0;
      sVar3 = 0;
      local_158 = 0;
      local_d0 = 1;
      local_148._0_16_ = (undefined1  [16])0x0;
      stack0xfffffffffffffec8 = (undefined1  [16])0x0;
      local_128 = (undefined1  [16])0x0;
      local_118 = (undefined1  [16])0x0;
      local_108 = (undefined1  [16])0x0;
      local_f8 = (undefined1  [16])0x0;
      local_e8 = (undefined1  [16])0x0;
      local_d8 = 0;
      secp256k1_ecmult((secp256k1_gej *)local_1c8,(secp256k1_gej *)local_148,&secp256k1_scalar_zero,
                       (secp256k1_scalar *)0x0);
      ppsVar2 = local_228;
      ctx_00 = local_250;
      do {
        secp256k1_pubkey_load(ctx_00,&local_2a8,ppsVar2[sVar3]);
        secp256k1_musig_keyaggcoef_internal
                  (&local_50,local_248,&local_2a8,(secp256k1_ge *)local_220);
        local_2b0 = local_2a8.infinity;
        local_328._32_8_ = local_2a8.x.n[4];
        local_328._16_8_ = local_2a8.x.n[2];
        local_328._24_8_ = local_2a8.x.n[3];
        local_328._0_8_ = local_2a8.x.n[0];
        local_328._8_8_ = local_2a8.x.n[1];
        local_328._72_8_ = local_2a8.y.n[4];
        local_328._56_8_ = local_2a8.y.n[2];
        local_328._64_8_ = local_2a8.y.n[3];
        local_328._40_8_ = local_2a8.y.n[0];
        local_328._48_8_ = local_2a8.y.n[1];
        local_328._80_8_ = 1;
        local_2c0 = (undefined1  [16])0x0;
        local_328._88_16_ = (undefined1  [16])0x0;
        rzr = (secp256k1_fe *)0x0;
        secp256k1_ecmult((secp256k1_gej *)local_148,(secp256k1_gej *)local_328,&local_50,
                         (secp256k1_scalar *)0x0);
        secp256k1_gej_add_var
                  ((secp256k1_gej *)local_1c8,(secp256k1_gej *)local_1c8,(secp256k1_gej *)local_148,
                   rzr);
        sVar3 = sVar3 + 1;
      } while (n_pubkeys != sVar3);
      secp256k1_ge_set_gej((secp256k1_ge *)local_328,(secp256k1_gej *)local_1c8);
      secp256k1_fe_impl_normalize_var((secp256k1_fe *)(local_328 + 0x28));
      if (keyagg_cache != (secp256k1_musig_keyagg_cache *)0x0) {
        puVar5 = (uint64_t *)local_328;
        psVar8 = (secp256k1_keyagg_cache_internal *)local_148;
        for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
          (psVar8->pk).x.n[0] = *puVar5;
          puVar5 = puVar5 + (ulong)bVar10 * -2 + 1;
          psVar8 = (secp256k1_keyagg_cache_internal *)((long)psVar8 + (ulong)bVar10 * -0x10 + 8);
        }
        puVar6 = (undefined8 *)local_220;
        puVar9 = (undefined8 *)(local_f8 + 8);
        for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar9 = *puVar6;
          puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
          puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
        }
        local_68 = (undefined1  [16])0x0;
        local_78 = (undefined1  [16])0x0;
        local_58._0_4_ = 0;
        local_58._4_4_ = 0;
        local_98[0] = local_248[0];
        local_98[1] = local_248[1];
        local_98[2] = local_248[2];
        local_98[3] = local_248[3];
        local_98[4] = local_248[4];
        local_98[5] = local_248[5];
        local_98[6] = local_248[6];
        local_98[7] = local_248[7];
        auStack_90[0] = auStack_240[0];
        auStack_90[1] = auStack_240[1];
        auStack_90[2] = auStack_240[2];
        auStack_90[3] = auStack_240[3];
        auStack_90[4] = auStack_240[4];
        auStack_90[5] = auStack_240[5];
        auStack_90[6] = auStack_240[6];
        auStack_90[7] = auStack_240[7];
        local_88[0] = local_238[0];
        local_88[1] = local_238[1];
        local_88[2] = local_238[2];
        local_88[3] = local_238[3];
        local_88[4] = local_238[4];
        local_88[5] = local_238[5];
        local_88[6] = local_238[6];
        local_88[7] = local_238[7];
        auStack_80[0] = auStack_230[0];
        auStack_80[1] = auStack_230[1];
        auStack_80[2] = auStack_230[2];
        auStack_80[3] = auStack_230[3];
        auStack_80[4] = auStack_230[4];
        auStack_80[5] = auStack_230[5];
        auStack_80[6] = auStack_230[6];
        auStack_80[7] = auStack_230[7];
        secp256k1_keyagg_cache_save(keyagg_cache,(secp256k1_keyagg_cache_internal *)local_148);
      }
      if (agg_pk != (secp256k1_xonly_pubkey *)0x0) {
        if ((local_328._40_8_ & 1) != 0) {
          local_328._40_8_ = 0x3ffffbfffff0bc - local_328._40_8_;
          local_328._48_8_ = 0x3ffffffffffffc - local_328._48_8_;
          local_328._56_8_ = 0x3ffffffffffffc - local_328._56_8_;
          local_328._64_8_ = 0x3ffffffffffffc - local_328._64_8_;
          local_328._72_8_ = 0x3fffffffffffc - local_328._72_8_;
        }
        secp256k1_ge_to_bytes(agg_pk->data,(secp256k1_ge *)local_328);
        return 1;
      }
      return 1;
    }
  }
  return 0;
code_r0x00110584:
  sVar3 = sVar3 + 1;
  if (sVar3 == n_pubkeys) goto LAB_001105bb;
  goto LAB_00110553;
}

Assistant:

int secp256k1_musig_pubkey_agg(const secp256k1_context* ctx, secp256k1_xonly_pubkey *agg_pk, secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_pubkey * const* pubkeys, size_t n_pubkeys) {
    secp256k1_musig_pubkey_agg_ecmult_data ecmult_data;
    secp256k1_gej pkj;
    secp256k1_ge pkp;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    if (agg_pk != NULL) {
        memset(agg_pk, 0, sizeof(*agg_pk));
    }
    ARG_CHECK(pubkeys != NULL);
    ARG_CHECK(n_pubkeys > 0);

    ecmult_data.ctx = ctx;
    ecmult_data.pks = pubkeys;

    secp256k1_ge_set_infinity(&ecmult_data.second_pk);
    for (i = 1; i < n_pubkeys; i++) {
        if (secp256k1_memcmp_var(pubkeys[0], pubkeys[i], sizeof(*pubkeys[0])) != 0) {
            secp256k1_ge pk;
            if (!secp256k1_pubkey_load(ctx, &pk, pubkeys[i])) {
                return 0;
            }
            ecmult_data.second_pk = pk;
            break;
        }
    }

    if (!secp256k1_musig_compute_pks_hash(ctx, ecmult_data.pks_hash, pubkeys, n_pubkeys)) {
        return 0;
    }
    /* TODO: actually use optimized ecmult_multi algorithms by providing a
     * scratch space */
    if (!secp256k1_ecmult_multi_var(&ctx->error_callback, NULL, &pkj, NULL, secp256k1_musig_pubkey_agg_callback, (void *) &ecmult_data, n_pubkeys)) {
        /* In order to reach this line with the current implementation of
         * ecmult_multi_var one would need to provide a callback that can
         * fail. */
        return 0;
    }
    secp256k1_ge_set_gej(&pkp, &pkj);
    secp256k1_fe_normalize_var(&pkp.y);
    /* The resulting public key is infinity with negligible probability */
    VERIFY_CHECK(!secp256k1_ge_is_infinity(&pkp));
    if (keyagg_cache != NULL) {
        secp256k1_keyagg_cache_internal cache_i = { 0 };
        cache_i.pk = pkp;
        cache_i.second_pk = ecmult_data.second_pk;
        memcpy(cache_i.pks_hash, ecmult_data.pks_hash, sizeof(cache_i.pks_hash));
        secp256k1_keyagg_cache_save(keyagg_cache, &cache_i);
    }

    if (agg_pk != NULL) {
        secp256k1_extrakeys_ge_even_y(&pkp);
        secp256k1_xonly_pubkey_save(agg_pk, &pkp);
    }
    return 1;
}